

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::resolveReference(Value *this,char *key)

{
  map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
  *this_00;
  bool bVar1;
  size_t sVar2;
  Value *__y;
  reference ppVar3;
  bool local_299;
  Value *value;
  _Base_ptr local_258;
  undefined1 local_250 [8];
  value_type defaultValue;
  _Self local_210;
  _Self local_208;
  iterator it;
  CZString actualKey;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream oss;
  char *key_local;
  Value *this_local;
  
  if (((*(ushort *)&this->field_0x8 & 0xff) != 0) && ((*(ushort *)&this->field_0x8 & 0xff) != 7)) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::operator<<((ostream *)local_198,"in Json::Value::resolveReference(): requires objectValue")
    ;
    std::__cxx11::ostringstream::str();
    throwLogicError(&local_1c8);
  }
  if ((*(ushort *)&this->field_0x8 & 0xff) == 0) {
    Value((Value *)&actualKey.field_1.storage_,objectValue);
    operator=(this,(Value *)&actualKey.field_1.storage_);
    ~Value((Value *)&actualKey.field_1.storage_);
  }
  sVar2 = strlen(key);
  CZString::CZString((CZString *)&it,key,(uint)sVar2,noDuplication);
  local_208._M_node =
       (_Base_ptr)
       std::
       map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
       ::lower_bound((this->value_).map_,(CZString *)&it);
  local_210._M_node =
       (_Base_ptr)
       std::
       map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
       ::end((this->value_).map_);
  bVar1 = std::operator!=(&local_208,&local_210);
  local_299 = false;
  if (bVar1) {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                       (&local_208);
    local_299 = CZString::operator==(&ppVar3->first,(CZString *)&it);
  }
  if (local_299 == false) {
    __y = nullSingleton();
    std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
              ((pair<const_Json::Value::CZString,_Json::Value> *)local_250,(CZString *)&it,__y);
    this_00 = (map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
               *)(this->value_).map_;
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator
              ((_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)
               &value,&local_208);
    local_258 = (_Base_ptr)
                std::
                map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                ::insert<std::pair<Json::Value::CZString_const,Json::Value>&>
                          (this_00,(const_iterator)value,
                           (pair<const_Json::Value::CZString,_Json::Value> *)local_250);
    local_208._M_node = local_258;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                       (&local_208);
    defaultValue.second.limit_._4_4_ = 1;
    std::pair<const_Json::Value::CZString,_Json::Value>::~pair
              ((pair<const_Json::Value::CZString,_Json::Value> *)local_250);
  }
  else {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                       (&local_208);
    defaultValue.second.limit_._4_4_ = 1;
  }
  this_local = &ppVar3->second;
  CZString::~CZString((CZString *)&it);
  return this_local;
}

Assistant:

Value& Value::resolveReference(const char* key) {
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == objectValue,
      "in Json::Value::resolveReference(): requires objectValue");
  if (type_ == nullValue)
    *this = Value(objectValue);
  CZString actualKey(
      key, static_cast<unsigned>(strlen(key)), CZString::noDuplication); // NOTE!
  ObjectValues::iterator it = value_.map_->lower_bound(actualKey);
  if (it != value_.map_->end() && (*it).first == actualKey)
    return (*it).second;

  ObjectValues::value_type defaultValue(actualKey, nullSingleton());
  it = value_.map_->insert(it, defaultValue);
  Value& value = (*it).second;
  return value;
}